

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesDictionary.cpp
# Opt level: O0

string * __thiscall
ResourcesDictionary::AddImageXObjectMapping_abi_cxx11_
          (string *__return_storage_ptr__,ResourcesDictionary *this,ObjectIDType inImageXObjectID)

{
  bool bVar1;
  pointer ppVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar3;
  pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  _Base_ptr local_d8;
  undefined1 local_d0;
  unsigned_long local_c8;
  BoxingBaseWithRW<unsigned_long,_STDStreamsReader<unsigned_long>,_STDStreamsWriter<unsigned_long>_>
  local_c0;
  string local_b8;
  undefined1 local_98 [8];
  string newName_1;
  _Self local_70;
  iterator it;
  unsigned_long local_58;
  BoxingBaseWithRW<unsigned_long,_STDStreamsReader<unsigned_long>,_STDStreamsWriter<unsigned_long>_>
  local_50;
  string local_48;
  undefined1 local_21;
  ObjectIDType local_20;
  ObjectIDType inImageXObjectID_local;
  ResourcesDictionary *this_local;
  string *newName;
  
  local_20 = inImageXObjectID;
  inImageXObjectID_local = (ObjectIDType)this;
  this_local = (ResourcesDictionary *)__return_storage_ptr__;
  if (inImageXObjectID == 0) {
    local_21 = 0;
    local_58 = this->mImageXObjectsCount + 1;
    BoxingBaseWithRW<unsigned_long,_STDStreamsReader<unsigned_long>,_STDStreamsWriter<unsigned_long>_>
    ::BoxingBaseWithRW(&local_50,&local_58);
    BoxingBaseWithRW<unsigned_long,STDStreamsReader<unsigned_long>,STDStreamsWriter<unsigned_long>>
    ::ToString_abi_cxx11_(&local_48,&local_50);
    std::operator+(__return_storage_ptr__,&scIM_abi_cxx11_,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    this->mImageXObjectsCount = this->mImageXObjectsCount + 1;
  }
  else {
    local_70._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->mXObjects,&local_20);
    newName_1.field_2._8_8_ =
         std::
         map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->mXObjects);
    bVar1 = std::operator==(&local_70,(_Self *)((long)&newName_1.field_2 + 8));
    if (bVar1) {
      local_c8 = this->mImageXObjectsCount + 1;
      BoxingBaseWithRW<unsigned_long,_STDStreamsReader<unsigned_long>,_STDStreamsWriter<unsigned_long>_>
      ::BoxingBaseWithRW(&local_c0,&local_c8);
      BoxingBaseWithRW<unsigned_long,STDStreamsReader<unsigned_long>,STDStreamsWriter<unsigned_long>>
      ::ToString_abi_cxx11_(&local_b8,&local_c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     &scIM_abi_cxx11_,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      this->mImageXObjectsCount = this->mImageXObjectsCount + 1;
      std::
      pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<unsigned_long_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_100,&local_20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      pVar3 = std::
              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::insert(&this->mXObjects,&local_100);
      local_d8 = (_Base_ptr)pVar3.first._M_node;
      local_d0 = pVar3.second;
      local_70._M_node = local_d8;
      std::
      pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_100);
      std::__cxx11::string::~string((string *)local_98);
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_70);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar2->second);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ResourcesDictionary::AddImageXObjectMapping(ObjectIDType inImageXObjectID)
{
    if(inImageXObjectID == 0)
    {
        std::string newName = scIM + ULong(mImageXObjectsCount+1).ToString();
        ++mImageXObjectsCount;
        return newName;
    }
    else 
    {
        ObjectIDTypeToStringMap::iterator it = mXObjects.find(inImageXObjectID);
        
        if(it == mXObjects.end())
        {
            std::string newName = scIM + ULong(mImageXObjectsCount+1).ToString();
            ++mImageXObjectsCount;
            it = mXObjects.insert(ObjectIDTypeToStringMap::value_type(inImageXObjectID,newName)).first;
        }
        return it->second;
    }
}